

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-options.c
# Opt level: O0

void do_cmd_hp_warn(char *name,wchar_t unused)

{
  char *str;
  ulong uVar1;
  byte local_1a;
  char local_19 [4];
  undefined1 local_15;
  undefined1 auStack_14 [2];
  uint8_t warn;
  char tmp [4];
  _Bool res;
  wchar_t unused_local;
  char *name_local;
  
  _auStack_14 = unused;
  unique0x100001ee = name;
  memset(local_19,0,4);
  strnfmt(local_19,4,"%i",(ulong)(player->opts).hitpoint_warn);
  screen_save();
  prt("",L'\x13',L'\0');
  prt("Command: Hitpoint Warning",L'\x14',L'\0');
  prt("New hitpoint warning (0-9): ",L'\x15',L'\0');
  str = format("Current hitpoint warning: %d (%d%%)",(ulong)(player->opts).hitpoint_warn,
               (ulong)((uint)(player->opts).hitpoint_warn * 10));
  prt(str,L'\x16',L'\0');
  prt("",L'\x17',L'\0');
  local_15 = askfor_aux(local_19,4,askfor_aux_numbers);
  if ((bool)local_15) {
    uVar1 = strtoul(local_19,(char **)0x0,0);
    local_1a = (byte)uVar1;
    if (9 < local_1a) {
      local_1a = 0;
    }
    (player->opts).hitpoint_warn = local_1a;
  }
  screen_load();
  return;
}

Assistant:

static void do_cmd_hp_warn(const char *name, int unused)
{
	bool res;
	char tmp[4] = "";
	uint8_t warn;

	strnfmt(tmp, sizeof(tmp), "%i", player->opts.hitpoint_warn);

	screen_save();

	/* Prompt */
	prt("", 19, 0);
	prt("Command: Hitpoint Warning", 20, 0);
	prt("New hitpoint warning (0-9): ", 21, 0);
	prt(format("Current hitpoint warning: %d (%d%%)",
		player->opts.hitpoint_warn, player->opts.hitpoint_warn * 10),
		22, 0);
	prt("", 23, 0);

	/* Ask the user for a string */
	res = askfor_aux(tmp, sizeof(tmp), askfor_aux_numbers);

	/* Process input */
	if (res) {
		warn = (uint8_t) strtoul(tmp, NULL, 0);
		
		/* Reset nonsensical warnings */
		if (warn > 9)
			warn = 0;

		player->opts.hitpoint_warn = warn;
	}

	screen_load();
}